

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O0

void __thiscall
duckdb::ParquetEncryptionConfig::ParquetEncryptionConfig
          (ParquetEncryptionConfig *this,ClientContext *context,Value *arg)

{
  ulong uVar1;
  LogicalTypeId LVar2;
  bool bVar3;
  byte bVar4;
  ClientContext *context_00;
  undefined8 uVar5;
  idx_t iVar6;
  string *psVar7;
  Value *in_RDX;
  string *in_RDI;
  ParquetKeys *keys_1;
  string footer_key_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *struct_key;
  idx_t i;
  ParquetKeys *keys;
  vector<duckdb::Value,_true> *children;
  child_list_t<LogicalType> *child_types;
  string *in_stack_fffffffffffffc88;
  Value *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  allocator *paVar8;
  ParquetKeys *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  Value *in_stack_fffffffffffffcd0;
  ParquetKeys *in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  Value *in_stack_fffffffffffffcf8;
  const_reference in_stack_fffffffffffffd00;
  string local_270 [39];
  allocator local_249;
  string local_248 [38];
  undefined1 local_222;
  allocator local_221;
  string local_220 [32];
  string local_200 [120];
  string local_188 [32];
  ParquetKeys *local_168;
  undefined1 local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [120];
  string local_b8 [32];
  string local_98 [32];
  const_reference local_78;
  ulong local_70;
  ParquetKeys *local_68;
  vector<duckdb::Value,_true> *local_60;
  child_list_t<LogicalType> *local_58;
  undefined1 local_4a;
  allocator local_49;
  string local_48 [48];
  Value *local_18;
  
  local_18 = in_RDX;
  ::std::__cxx11::string::string(in_RDI);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x231fb18);
  context_00 = (ClientContext *)Value::type(local_18);
  LVar2 = LogicalType::id((LogicalType *)context_00);
  if (LVar2 != STRUCT) {
    local_4a = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_48,"Parquet encryption_config must be of type STRUCT",&local_49);
    BinderException::BinderException
              ((BinderException *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_4a = 0;
    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  Value::type(local_18);
  local_58 = StructType::GetChildTypes_abi_cxx11_(&in_stack_fffffffffffffc90->type_);
  local_60 = StructValue::GetChildren(in_stack_fffffffffffffcd0);
  local_68 = ParquetKeys::Get(context_00);
  local_70 = 0;
  do {
    uVar1 = local_70;
    Value::type(local_18);
    iVar6 = StructType::GetChildCount((LogicalType *)0x231fd27);
    if (iVar6 <= uVar1) {
      return;
    }
    local_78 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                             *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88);
    StringUtil::Lower((string *)in_stack_fffffffffffffcd8);
    bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
    ::std::__cxx11::string::~string(local_98);
    if (bVar3) {
      in_stack_fffffffffffffd00 =
           vector<duckdb::Value,_true>::operator[]
                     ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffc90,
                      (size_type)in_stack_fffffffffffffc88);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                 (LogicalTypeId)((ulong)in_stack_fffffffffffffca8 >> 0x38));
      Value::DefaultCastAs
                (in_stack_fffffffffffffcf8,
                 (LogicalType *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 SUB81((ulong)in_stack_fffffffffffffce8 >> 0x38,0));
      in_stack_fffffffffffffcf8 = (Value *)StringValue::Get_abi_cxx11_(in_stack_fffffffffffffcd0);
      ::std::__cxx11::string::string(local_b8,(string *)in_stack_fffffffffffffcf8);
      Value::~Value(in_stack_fffffffffffffc90);
      LogicalType::~LogicalType((LogicalType *)0x231fe5a);
      in_stack_fffffffffffffcf7 =
           ParquetKeys::HasKey(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      if (!(bool)in_stack_fffffffffffffcf7) {
        local_159 = 1;
        uVar5 = __cxa_allocate_exception(0x10);
        paVar8 = &local_131;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_130,
                   "No key with name \"%s\" exists. Add it with PRAGMA add_parquet_key(\'<key_name>\',\'<key>\');"
                   ,paVar8);
        ::std::__cxx11::string::string(local_158,local_b8);
        BinderException::BinderException<std::__cxx11::string>
                  ((BinderException *)in_stack_fffffffffffffd00,(string *)in_stack_fffffffffffffcf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
        local_159 = 0;
        __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
      }
      in_stack_fffffffffffffcd8 = ParquetKeys::Get(context_00);
      local_168 = in_stack_fffffffffffffcd8;
      in_stack_fffffffffffffcd0 =
           (Value *)ParquetKeys::GetKey((ParquetKeys *)in_stack_fffffffffffffc90,
                                        in_stack_fffffffffffffc88);
      ::std::__cxx11::string::operator=(in_RDI,(string *)in_stack_fffffffffffffcd0);
      ::std::__cxx11::string::~string(local_b8);
    }
    else {
      StringUtil::Lower((string *)in_stack_fffffffffffffcd8);
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
      ::std::__cxx11::string::~string(local_188);
      if (!bVar3) {
        StringUtil::Lower((string *)in_stack_fffffffffffffcd8);
        bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
        ::std::__cxx11::string::~string(local_200);
        if ((bVar4 & 1) == 0) {
          uVar5 = __cxa_allocate_exception(0x10);
          paVar8 = &local_249;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_248,"Unknown key in encryption_config \"%s\"",paVar8)
          ;
          ::std::__cxx11::string::string(local_270,(string *)local_78);
          BinderException::BinderException<std::__cxx11::string>
                    ((BinderException *)in_stack_fffffffffffffd00,
                     (string *)in_stack_fffffffffffffcf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
          __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
        }
        local_222 = 1;
        uVar5 = __cxa_allocate_exception(0x10);
        paVar8 = &local_221;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_220,"Parquet encryption_config column_keys not yet implemented",paVar8);
        NotImplementedException::NotImplementedException
                  ((NotImplementedException *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        local_222 = 0;
        __cxa_throw(uVar5,&NotImplementedException::typeinfo,
                    NotImplementedException::~NotImplementedException);
      }
      vector<duckdb::Value,_true>::operator[]
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffc90,
                 (size_type)in_stack_fffffffffffffc88);
      LogicalType::LogicalType
                ((LogicalType *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                 (LogicalTypeId)((ulong)in_stack_fffffffffffffca8 >> 0x38));
      Value::DefaultCastAs
                (in_stack_fffffffffffffcf8,
                 (LogicalType *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
                 SUB81((ulong)in_stack_fffffffffffffce8 >> 0x38,0));
      psVar7 = StringValue::Get_abi_cxx11_(in_stack_fffffffffffffcd0);
      ::std::__cxx11::string::operator=(in_RDI,(string *)psVar7);
      Value::~Value(in_stack_fffffffffffffc90);
      LogicalType::~LogicalType((LogicalType *)0x2320176);
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

ParquetEncryptionConfig::ParquetEncryptionConfig(ClientContext &context, const Value &arg) {
	if (arg.type().id() != LogicalTypeId::STRUCT) {
		throw BinderException("Parquet encryption_config must be of type STRUCT");
	}
	const auto &child_types = StructType::GetChildTypes(arg.type());
	auto &children = StructValue::GetChildren(arg);
	const auto &keys = ParquetKeys::Get(context);
	for (idx_t i = 0; i < StructType::GetChildCount(arg.type()); i++) {
		auto &struct_key = child_types[i].first;
		if (StringUtil::Lower(struct_key) == "footer_key") {
			const auto footer_key_name = StringValue::Get(children[i].DefaultCastAs(LogicalType::VARCHAR));
			if (!keys.HasKey(footer_key_name)) {
				throw BinderException(
				    "No key with name \"%s\" exists. Add it with PRAGMA add_parquet_key('<key_name>','<key>');",
				    footer_key_name);
			}
			// footer key name provided - read the key from the config
			const auto &keys = ParquetKeys::Get(context);
			footer_key = keys.GetKey(footer_key_name);
		} else if (StringUtil::Lower(struct_key) == "footer_key_value") {
			footer_key = StringValue::Get(children[i].DefaultCastAs(LogicalType::BLOB));
		} else if (StringUtil::Lower(struct_key) == "column_keys") {
			throw NotImplementedException("Parquet encryption_config column_keys not yet implemented");
		} else {
			throw BinderException("Unknown key in encryption_config \"%s\"", struct_key);
		}
	}
}